

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O1

TProb<double> *
libDAI::min<double>(TProb<double> *__return_storage_ptr__,TProb<double> *a,TProb<double> *b)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  long lVar5;
  size_type __n;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  allocator_type local_21;
  double local_20;
  
  __n = (long)(a->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(a->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3;
  auVar4 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,__n);
  local_20 = 1.0 / auVar4._0_8_;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->_p,__n,&local_20,&local_21);
  pdVar1 = (a->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(a->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    pdVar2 = (b->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = pdVar1[lVar6];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = pdVar2[lVar6];
      auVar4 = vminsd_avx(auVar7,auVar4);
      pdVar3[lVar6] = auVar4._0_8_;
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

TProb<T> min( const TProb<T> &a, const TProb<T> &b ) {
        assert( a.size() == b.size() );
        TProb<T> result( a.size() );
        for( size_t i = 0; i < a.size(); i++ )
            if( a[i] < b[i] )
                result[i] = a[i];
            else
                result[i] = b[i];
        return result;
    }